

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::applyConvertOut<QCmyk32,unsigned_int>
          (QColorTransformPrivate *this,QCmyk32 *dst,uint *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  bool bVar1;
  Int IVar2;
  QColorSpacePrivate *pQVar3;
  QColorVector *in_RCX;
  QCmyk32 *in_RDX;
  uint *in_R8;
  long in_FS_OFFSET;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *element;
  QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
  *__range2;
  ApplyMatrixForm doClamp;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_ffffffffffffff78;
  TransformFlag in_stack_ffffffffffffff7c;
  QColorVector *in_stack_ffffffffffffff80;
  QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
  *src_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  QFlagsStorageHelper<QColorTransformPrivate::TransformFlag,_4> local_44;
  QColorVector **local_40;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *local_30;
  const_iterator local_28;
  const_iterator local_20;
  QColorVector *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 1;
  local_18[0] = in_RCX;
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d753f);
  src_00 = &pQVar3->mBA;
  local_20.i = (variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
             ::begin((QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
                      *)in_stack_ffffffffffffff80);
  local_28.i = (variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
             ::end((QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
                    *)in_stack_ffffffffffffff80);
  while( true ) {
    local_30 = local_28.i;
    bVar1 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
            ::const_iterator::operator!=(&local_20,local_28);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         (QColorVector *)
         QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
         ::const_iterator::operator*(&local_20);
    local_40 = local_18;
    std::
    visit<QColorTransformPrivate::applyConvertOut<QCmyk32,unsigned_int>(QCmyk32*,unsigned_int_const*,QColorVector*,long_long,QFlags<QColorTransformPrivate::TransformFlag>)const::_lambda(auto:1&&)_1_,std::variant<QColorSpacePrivate::TransferElement,QColorMatrix,QColorVector,QColorCLUT>const&>
              ((anon_class_16_2_4b7f43a0 *)in_stack_ffffffffffffff80,
               (variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
    ::const_iterator::operator++(&local_20);
  }
  clampIfNeeded<(ApplyMatrixForm)1>(local_18[0],(qsizetype)in_R8);
  local_44.super_QFlagsStorage<QColorTransformPrivate::TransformFlag>.i =
       (QFlagsStorage<QColorTransformPrivate::TransformFlag>)
       QFlags<QColorTransformPrivate::TransformFlag>::operator&
                 ((QFlags<QColorTransformPrivate::TransformFlag> *)in_stack_ffffffffffffff80,
                  in_stack_ffffffffffffff7c);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
  if (IVar2 == 0) {
    storeUnpremultipliedLUT<unsigned_int>
              (in_RDX,in_R8,(QColorVector *)CONCAT44(uVar4,in_stack_ffffffffffffff90),
               (qsizetype)src_00);
  }
  else {
    storePremultipliedLUT<unsigned_int>
              ((QCmyk32 *)CONCAT44(uVar4,in_stack_ffffffffffffff90),(uint *)src_00,
               in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::applyConvertOut(D *dst, const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    constexpr ApplyMatrixForm doClamp = UnclampedValues<D> ? DoNotClamp : DoClamp;
    if constexpr (IsGrayscale<D>) {
        Q_UNUSED(src); // dealing with buggy warnings in gcc 9
        Q_UNUSED(flags);
        // Calculate the matrix for grayscale conversion
        QColorMatrix grayMatrix;
        if (colorSpaceIn == colorSpaceOut ||
                (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray &&
                 colorSpaceOut->colorModel == QColorSpace::ColorModel::Gray)) {
            // colorMatrix already has the right form
            grayMatrix = colorMatrix;
        } else {
            if constexpr (IsGrayscale<S>) {
                if (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray)
                    grayMatrix = colorSpaceIn->chad;
                else
                    grayMatrix = QColorMatrix::identity(); // Otherwise already handled in applyConvertIn
            } else {
                if (colorSpaceIn->isThreeComponentMatrix())
                    grayMatrix = colorSpaceIn->toXyz;
                else
                    grayMatrix = QColorMatrix::identity();
            }
            if (!colorSpaceOut->chad.isNull())
                grayMatrix = colorSpaceOut->chad.inverted() * grayMatrix;
        }

        applyMatrix<doClamp>(buffer, len, grayMatrix);
        storeOpaque(dst, buffer, len, this);
        return;
    } else if constexpr (CanUseThreeComponent<D>) {
        if (colorSpaceOut->isThreeComponentMatrix()) {
            if (IsGrayscale<S> && colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray)
                applyMatrix<doClamp>(buffer, len, colorSpaceOut->toXyz.inverted()); // colorMatrix wasnt prepared for gray input
            else
                applyMatrix<doClamp>(buffer, len, colorMatrix);

            if constexpr (IsAlwaysOpaque<S>) {
                storeOpaque(dst, buffer, len, this);
            } else {
                if (flags & InputOpaque)
                    storeOpaque(dst, buffer, len, this);
                else if (flags & OutputPremultiplied)
                    storePremultiplied(dst, src, buffer, len, this);
                else
                    storeUnpremultiplied(dst, src, buffer, len, this);
            }
            return;
        }
    }
    if constexpr (!IsGrayscale<D>) {
        Q_ASSERT(!colorSpaceOut->isThreeComponentMatrix());

        // Do element based conversion
        for (auto &&element : colorSpaceOut->mBA)
            std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);

        clampIfNeeded<doClamp>(buffer, len);

        if (flags & OutputPremultiplied)
            storePremultipliedLUT(dst, src, buffer, len);
        else
            storeUnpremultipliedLUT(dst, src, buffer, len);
    } else {
        Q_UNREACHABLE();
    }
}